

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O1

void __thiscall re2c::dfa_t::~dfa_t(dfa_t *this)

{
  pointer ppdVar1;
  dfa_state_t *pdVar2;
  pointer ppdVar3;
  
  ppdVar1 = (this->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppdVar3 = (this->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppdVar3 != ppdVar1; ppdVar3 = ppdVar3 + 1
      ) {
    pdVar2 = *ppdVar3;
    if (pdVar2 != (dfa_state_t *)0x0) {
      if (pdVar2->arcs != (size_t *)0x0) {
        operator_delete__(pdVar2->arcs);
      }
      operator_delete(pdVar2,0x18);
    }
  }
  ppdVar3 = (this->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppdVar3 != (pointer)0x0) {
    operator_delete(ppdVar3,(long)(this->states).
                                  super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppdVar3
                   );
    return;
  }
  return;
}

Assistant:

dfa_t::~dfa_t()
{
	std::vector<dfa_state_t*>::iterator
		i = states.begin(),
		e = states.end();
	for (; i != e; ++i)
	{
		delete *i;
	}
}